

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Genetic.cpp
# Opt level: O1

void Genetic::clear(void)

{
  Solution *this;
  _List_node_base *p_Var1;
  _List_node_base *p_Var2;
  
  for (p_Var2 = solutions_abi_cxx11_.
                super__List_base<std::pair<Solution_*,_double>,_std::allocator<std::pair<Solution_*,_double>_>_>
                ._M_impl._M_node.super__List_node_base._M_next;
      p_Var1 = solutions_abi_cxx11_.
               super__List_base<std::pair<Solution_*,_double>,_std::allocator<std::pair<Solution_*,_double>_>_>
               ._M_impl._M_node.super__List_node_base._M_next,
      p_Var2 != (_List_node_base *)&solutions_abi_cxx11_;
      p_Var2 = (((_List_base<std::pair<Solution_*,_double>,_std::allocator<std::pair<Solution_*,_double>_>_>
                  *)&p_Var2->_M_next)->_M_impl)._M_node.super__List_node_base._M_next) {
    this = (Solution *)p_Var2[1]._M_next;
    if (this != (Solution *)0x0) {
      Solution::~Solution(this);
      operator_delete(this);
    }
  }
  while (p_Var1 != (_List_node_base *)&solutions_abi_cxx11_) {
    p_Var2 = (((_List_base<std::pair<Solution_*,_double>,_std::allocator<std::pair<Solution_*,_double>_>_>
                *)&p_Var1->_M_next)->_M_impl)._M_node.super__List_node_base._M_next;
    operator_delete(p_Var1);
    p_Var1 = p_Var2;
  }
  solutions_abi_cxx11_.
  super__List_base<std::pair<Solution_*,_double>,_std::allocator<std::pair<Solution_*,_double>_>_>.
  _M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)&solutions_abi_cxx11_;
  solutions_abi_cxx11_.
  super__List_base<std::pair<Solution_*,_double>,_std::allocator<std::pair<Solution_*,_double>_>_>.
  _M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&solutions_abi_cxx11_;
  solutions_abi_cxx11_.
  super__List_base<std::pair<Solution_*,_double>,_std::allocator<std::pair<Solution_*,_double>_>_>.
  _M_impl._M_node._M_size = 0;
  ticket_max = 0.0;
  max_weight = 0.0;
  return;
}

Assistant:

void Genetic::clear()
{
	for (auto solution : solutions)
	{
		delete solution.first;
	}
	solutions.clear();
	ticket_max = 0;
	max_weight = 0;
}